

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O0

int Msat_ReadDimacs(char *pText,Msat_Solver_t **pS,int fVerbose)

{
  int iVar1;
  int nClas;
  int nVars;
  char *pIn;
  Msat_IntVec_t *pLits;
  Msat_Solver_t *p;
  Msat_Solver_t **ppMStack_20;
  int fVerbose_local;
  Msat_Solver_t **pS_local;
  char *pText_local;
  
  pLits = (Msat_IntVec_t *)0x0;
  pIn = (char *)0x0;
  _nClas = pText;
  p._4_4_ = fVerbose;
  ppMStack_20 = pS;
  pS_local = (Msat_Solver_t **)pText;
  while( true ) {
    while( true ) {
      while( true ) {
        Msat_ReadWhitespace((char **)&nClas);
        if (*_nClas == '\0') {
          Msat_IntVecFree((Msat_IntVec_t *)pIn);
          *ppMStack_20 = (Msat_Solver_t *)pLits;
          iVar1 = Msat_SolverSimplifyDB((Msat_Solver_t *)pLits);
          return iVar1;
        }
        if (*_nClas != 'c') break;
        skipLine((char **)&nClas);
      }
      if (*_nClas != 'p') break;
      _nClas = _nClas + 1;
      Msat_ReadWhitespace((char **)&nClas);
      Msat_ReadNotWhitespace((char **)&nClas);
      iVar1 = Msat_ReadInt((char **)&nClas);
      Msat_ReadInt((char **)&nClas);
      skipLine((char **)&nClas);
      pLits = (Msat_IntVec_t *)Msat_SolverAlloc(iVar1,1.0,1.0,1.0,1.0,0);
      Msat_SolverClean((Msat_Solver_t *)pLits,iVar1);
      Msat_SolverSetVerbosity((Msat_Solver_t *)pLits,p._4_4_);
      pIn = (char *)Msat_IntVecAlloc(iVar1);
    }
    if (pLits == (Msat_IntVec_t *)0x0) break;
    Msat_ReadClause((char **)&nClas,(Msat_Solver_t *)pLits,(Msat_IntVec_t *)pIn);
    iVar1 = Msat_SolverAddClause((Msat_Solver_t *)pLits,(Msat_IntVec_t *)pIn);
    if (iVar1 == 0) {
      return 0;
    }
  }
  printf("There is no parameter line.\n");
  exit(1);
}

Assistant:

static int  Msat_ReadDimacs( char * pText, Msat_Solver_t ** pS, int  fVerbose ) 
{
    Msat_Solver_t * p = NULL; // Suppress "might be used uninitialized"
    Msat_IntVec_t * pLits = NULL; // Suppress "might be used uninitialized"
    char * pIn = pText;
    int nVars, nClas;
    while ( 1 )
    {
        Msat_ReadWhitespace( &pIn );
        if ( *pIn == 0 )
            break;
        else if ( *pIn == 'c' )
            skipLine( &pIn );
        else if ( *pIn == 'p' )
        {
            pIn++;
            Msat_ReadWhitespace( &pIn );
            Msat_ReadNotWhitespace( &pIn );

            nVars = Msat_ReadInt( &pIn );
            nClas = Msat_ReadInt( &pIn );
            skipLine( &pIn );
            // start the solver
            p = Msat_SolverAlloc( nVars, 1, 1, 1, 1, 0 ); 
            Msat_SolverClean( p, nVars );
            Msat_SolverSetVerbosity( p, fVerbose );
            // allocate the vector
            pLits = Msat_IntVecAlloc( nVars );
        }
        else
        {
            if ( p == NULL )
            {
                printf( "There is no parameter line.\n" );
                exit(1);
            }
            Msat_ReadClause( &pIn, p, pLits );
            if ( !Msat_SolverAddClause( p, pLits ) )
                return 0;
        }
    }
    Msat_IntVecFree( pLits );
    *pS = p;
    return Msat_SolverSimplifyDB( p );
}